

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall
ON_RevSurface::Split
          (ON_RevSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  ON_BoundingBox *this_00;
  ON_BoundingBox *this_01;
  ON_RevSurface *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  double *pdVar10;
  ON_Curve *this_02;
  ON_Curve *pOVar11;
  ON_RevSurface *this_03;
  ON_RevSurface *this_04;
  uint uVar12;
  ON_Curve *right_side;
  ON_Interval left_t;
  ON_Interval right_angle;
  ON_Interval left_angle;
  ON_Interval right_t;
  ON_BoundingBox input_bbox;
  ON_Curve *local_f8;
  double local_f0;
  ON_Curve *local_e8;
  ON_Surface **local_e0;
  ON_Interval local_d8;
  ON_Interval local_c8;
  ON_Interval local_b8;
  ON_Interval local_a8;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  pOVar1 = (ON_RevSurface *)*west_or_south_side;
  local_e0 = east_or_north_side;
  if (pOVar1 == (ON_RevSurface *)0x0) {
    this_03 = (ON_RevSurface *)0x0;
  }
  else {
    bVar7 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_RevSurface_class_rtti);
    this_03 = (ON_RevSurface *)0x0;
    if (bVar7) {
      this_03 = pOVar1;
    }
  }
  pOVar1 = (ON_RevSurface *)*local_e0;
  if (pOVar1 == (ON_RevSurface *)0x0) {
    this_04 = (ON_RevSurface *)0x0;
  }
  else {
    bVar7 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_RevSurface_class_rtti);
    this_04 = (ON_RevSurface *)0x0;
    if (bVar7) {
      this_04 = pOVar1;
    }
  }
  if ((this_03 == (ON_RevSurface *)0x0 || this_03 != this_04) &&
     ((this_03 != (ON_RevSurface *)0x0 || (*west_or_south_side == (ON_Surface *)0x0)))) {
    cVar8 = '\0';
    if (((uint)dir < 2) && (this_04 != (ON_RevSurface *)0x0 || *local_e0 == (ON_Surface *)0x0)) {
      local_e8 = (ON_Curve *)0x0;
      local_f8 = (ON_Curve *)0x0;
      uVar12 = (uint)(byte)~(byte)dir;
      if (this->m_bTransposed == false) {
        uVar12 = dir;
      }
      ON_Interval::ON_Interval(&local_b8);
      ON_Interval::ON_Interval(&local_c8);
      ON_Interval::ON_Interval(&local_d8);
      ON_Interval::ON_Interval(&local_a8);
      local_b8.m_t[0] = (this->m_angle).m_t[0];
      local_b8.m_t[1] = (this->m_angle).m_t[1];
      local_c8.m_t[0] = (this->m_angle).m_t[0];
      local_c8.m_t[1] = (this->m_angle).m_t[1];
      local_d8.m_t[0] = (this->m_t).m_t[0];
      local_d8.m_t[1] = (this->m_t).m_t[1];
      local_a8.m_t[0] = (this->m_t).m_t[0];
      local_a8.m_t[1] = (this->m_t).m_t[1];
      if ((uVar12 & 1) == 0) {
        local_f0 = ON_Interval::NormalizedParameterAt(&this->m_t,c);
        bVar7 = ON_Interval::Includes(&this->m_t,c,true);
        cVar8 = '\0';
        pOVar11 = local_f8;
        if (((local_f0 < 1.0) && (bVar7)) && (0.0 < local_f0)) {
          local_f0 = ON_Interval::ParameterAt(&this->m_angle,local_f0);
          cVar8 = ON_Interval::Includes(&this->m_angle,local_f0,true);
          pOVar11 = local_f8;
          if ((bool)cVar8) {
            pdVar10 = ON_Interval::operator[](&local_b8,1);
            *pdVar10 = local_f0;
            pdVar10 = ON_Interval::operator[](&local_c8,0);
            *pdVar10 = local_f0;
            pdVar10 = ON_Interval::operator[](&local_d8,1);
            *pdVar10 = c;
            pdVar10 = ON_Interval::operator[](&local_a8,0);
            *pdVar10 = c;
            this_02 = this->m_curve;
            if (this_03 != this) {
              this_02 = ON_Curve::Duplicate(this_02);
            }
            pOVar11 = this->m_curve;
            local_e8 = this_02;
            if (this_04 != this) {
              pOVar11 = ON_Curve::Duplicate(this->m_curve);
            }
          }
        }
      }
      else {
        pOVar11 = this->m_curve;
        if (pOVar11 == (ON_Curve *)0x0) {
          cVar8 = '\0';
          pOVar11 = local_f8;
        }
        else {
          iVar9 = (*(pOVar11->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                            (SUB84(c,0),pOVar11,&local_e8,&local_f8);
          cVar8 = (char)iVar9;
          pOVar11 = local_f8;
          if (cVar8 != '\0') {
            if (this_03 == this) {
              if (this->m_curve != (ON_Curve *)0x0) {
                (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              this_03->m_curve = local_e8;
              pOVar11 = local_f8;
            }
            else if (this_04 == this) {
              if (this->m_curve != (ON_Curve *)0x0) {
                (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              this_04->m_curve = local_f8;
              pOVar11 = local_f8;
            }
          }
        }
      }
      local_f8 = pOVar11;
      if (cVar8 != '\0') {
        local_98.m_min.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.x;
        local_98.m_min.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.x + 4);
        local_98.m_min.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.y;
        local_98.m_min.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.y + 4);
        local_98.m_min.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.z;
        local_98.m_min.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.z + 4);
        local_98.m_max.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.x;
        local_98.m_max.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.x + 4);
        local_98.m_max.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.y;
        local_98.m_max.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.y + 4);
        local_98.m_max.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.z;
        local_98.m_max.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.z + 4);
        if (this_03 == (ON_RevSurface *)0x0) {
          this_03 = (ON_RevSurface *)operator_new(0xa0);
          ON_RevSurface(this_03);
          *west_or_south_side = (ON_Surface *)this_03;
        }
        else if ((this_03 != this) && (this_03->m_curve != (ON_Curve *)0x0)) {
          (*(this_03->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          this_03->m_curve = (ON_Curve *)0x0;
        }
        if (this_04 == (ON_RevSurface *)0x0) {
          this_04 = (ON_RevSurface *)operator_new(0xa0);
          ON_RevSurface(this_04);
          *local_e0 = (ON_Surface *)this_04;
        }
        if ((this_04 != this) && (this_04->m_curve != (ON_Curve *)0x0)) {
          (*(this_04->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          this_04->m_curve = (ON_Curve *)0x0;
        }
        dVar2 = (this->m_axis).from.x;
        dVar3 = (this->m_axis).from.y;
        dVar4 = (this->m_axis).from.z;
        dVar5 = (this->m_axis).to.x;
        dVar6 = (this->m_axis).to.z;
        (this_03->m_axis).to.y = (this->m_axis).to.y;
        (this_03->m_axis).to.z = dVar6;
        (this_03->m_axis).from.z = dVar4;
        (this_03->m_axis).to.x = dVar5;
        (this_03->m_axis).from.x = dVar2;
        (this_03->m_axis).from.y = dVar3;
        (this_03->m_angle).m_t[0] = local_b8.m_t[0];
        (this_03->m_angle).m_t[1] = local_b8.m_t[1];
        (this_03->m_t).m_t[0] = local_d8.m_t[0];
        (this_03->m_t).m_t[1] = local_d8.m_t[1];
        this_03->m_bTransposed = this->m_bTransposed;
        this_03->m_curve = local_e8;
        this_00 = &this_03->m_bbox;
        ON_BoundingBox::Destroy(this_00);
        dVar2 = (this->m_axis).from.x;
        dVar3 = (this->m_axis).from.y;
        dVar4 = (this->m_axis).from.z;
        dVar5 = (this->m_axis).to.x;
        dVar6 = (this->m_axis).to.z;
        (this_04->m_axis).to.y = (this->m_axis).to.y;
        (this_04->m_axis).to.z = dVar6;
        (this_04->m_axis).from.z = dVar4;
        (this_04->m_axis).to.x = dVar5;
        (this_04->m_axis).from.x = dVar2;
        (this_04->m_axis).from.y = dVar3;
        (this_04->m_angle).m_t[0] = local_c8.m_t[0];
        (this_04->m_angle).m_t[1] = local_c8.m_t[1];
        (this_04->m_t).m_t[0] = local_a8.m_t[0];
        (this_04->m_t).m_t[1] = local_a8.m_t[1];
        this_04->m_bTransposed = this->m_bTransposed;
        this_04->m_curve = local_f8;
        this_01 = &this_04->m_bbox;
        ON_BoundingBox::Destroy(this_01);
        ON_Geometry::BoundingBox(&local_60,(ON_Geometry *)this_03);
        bVar7 = ON_BoundingBox::IsValid(this_00);
        if ((bVar7) && (bVar7 = ON_BoundingBox::IsValid(&local_98), bVar7)) {
          ON_BoundingBox::Intersection(this_00,&local_98);
        }
        ON_Geometry::BoundingBox(&local_60,(ON_Geometry *)this_04);
        bVar7 = ON_BoundingBox::IsValid(this_01);
        if ((bVar7) && (bVar7 = ON_BoundingBox::IsValid(&local_98), bVar7)) {
          ON_BoundingBox::Intersection(this_01,&local_98);
        }
      }
    }
  }
  else {
    cVar8 = '\0';
  }
  return (bool)cVar8;
}

Assistant:

bool ON_RevSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  bool rc = false;

  ON_RevSurface* srf_ws=ON_RevSurface::Cast(west_or_south_side);
  ON_RevSurface* srf_en=ON_RevSurface::Cast(east_or_north_side);
  if ( srf_ws && srf_ws == srf_en )
    return false;
  if ( west_or_south_side && !srf_ws )
    return false;
  if ( east_or_north_side && !srf_en )
    return false;

  if ( dir != 0 && dir != 1 )
    return false;
  if ( m_bTransposed )
    dir = 1-dir;

  ON_Curve* left_side = 0;
  ON_Curve* right_side = 0;
  ON_Interval left_angle, right_angle;
  ON_Interval left_t, right_t;
  left_angle = m_angle;
  right_angle = m_angle;
  left_t = m_t;
  right_t = m_t;

  if ( dir == 0 )
  {
    double t = m_t.NormalizedParameterAt(c);
    if ( m_t.Includes(c,true) && 0.0 < t && t < 1.0 )
    {
      double a = m_angle.ParameterAt( t );
      if ( m_angle.Includes(a,true) )
      {
        rc = true;

        left_angle[1] = a;
        right_angle[0] = a;
        left_t[1] = c;
        right_t[0] = c;

        if ( srf_ws == this )
          left_side = m_curve;
        else
          left_side = m_curve->Duplicate();
        if ( srf_en == this )
          right_side = m_curve;
        else
          right_side = m_curve->Duplicate();
      }
    }
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Split( c, left_side, right_side );
    if ( rc )
    {
      if ( this == srf_ws )
      {
        delete m_curve;
        srf_ws->m_curve = left_side;
      }
      else if ( this == srf_en )
      {
        delete m_curve;
        srf_en->m_curve = right_side;
      }
    }
  }

  if ( rc )
  {
    // save input bounding box
    const ON_BoundingBox input_bbox(m_bbox);

    if ( !srf_ws )
      west_or_south_side = srf_ws = new ON_RevSurface();
    else if ( srf_ws != this && srf_ws->m_curve )
    {
      delete srf_ws->m_curve;
      srf_ws->m_curve = 0;
    }
    if ( !srf_en )
      east_or_north_side = srf_en = new ON_RevSurface();
    if ( srf_en != this && srf_en->m_curve )
    {
      delete srf_en->m_curve;
      srf_en->m_curve = 0;
    }

    srf_ws->m_axis = m_axis;
    srf_ws->m_angle = left_angle;
    srf_ws->m_t = left_t;
    srf_ws->m_bTransposed = m_bTransposed;
    srf_ws->m_curve = left_side;
    srf_ws->m_bbox.Destroy();

    srf_en->m_axis = m_axis;
    srf_en->m_angle = right_angle;
    srf_en->m_t = right_t;
    srf_en->m_bTransposed = m_bTransposed;
    srf_en->m_curve = right_side;
    srf_en->m_bbox.Destroy();

    // update bounding boxes
    // if input box was valid, intersect calculated boxes with
    // input box
    srf_ws->BoundingBox(); // calculates srf_ws->m_bbox
    if ( srf_ws->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_ws->m_bbox.Intersection(input_bbox);

    srf_en->BoundingBox(); // calculates srf_en->m_bbox
    if ( srf_en->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_en->m_bbox.Intersection(input_bbox);
  }

  return rc;
}